

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
::
initialize<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
          (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
           *this,Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                 *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                )0x1) {
    *(pointer *)(this + 8) =
         (value->_value).
         super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x10) =
         (value->_value).
         super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x18) =
         (value->_value).
         super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_value).
    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (value->_value).
    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_value).
    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined2 *)(this + 0x20) = *(undefined2 *)&value->_has_value;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x30) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x38) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this[0x40] = (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                  )(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
             )0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<float, 4>>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<std::array<float, 4>>>, V = tinyusdz::Animatable<std::vector<std::array<float, 4>>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }